

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O1

int * mxCallocInt(int n)

{
  int *__s;
  char msg [256];
  char acStack_118 [256];
  
  __s = (int *)superlu_malloc((long)n << 2);
  if (__s == (int *)0x0) {
    sprintf(acStack_118,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in mxCallocInt()"
            ,0x44,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sp_coletree.c"
           );
    superlu_abort_and_exit(acStack_118);
  }
  if (0 < n) {
    memset(__s,0,(ulong)(uint)n << 2);
  }
  return __s;
}

Assistant:

static 
int *mxCallocInt(int n)
{
    register int i;
    int *buf;

    buf = (int *) SUPERLU_MALLOC( n * sizeof(int) );
    if ( !buf ) {
         ABORT("SUPERLU_MALLOC fails for buf in mxCallocInt()");
       }
    for (i = 0; i < n; i++) buf[i] = 0;
    return (buf);
}